

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QTzType> * parseTzTypes(QDataStream *ds,int tzh_typecnt)

{
  QDataStream *this;
  int in_EDX;
  QDataStream *in_RSI;
  QList<QTzType> *in_RDI;
  QTzType *type;
  int i;
  QList<QTzType> *types;
  undefined4 in_stack_ffffffffffffff98;
  Status in_stack_ffffffffffffff9c;
  Status in_stack_ffffffffffffffa0;
  Status in_stack_ffffffffffffffa4;
  qsizetype in_stack_ffffffffffffffa8;
  Status in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int local_1c;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzType>::QList
            ((QList<QTzType> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  local_1c = 0;
  while( true ) {
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (local_1c < in_EDX) {
      in_stack_ffffffffffffffb0 = QDataStream::status(in_RSI);
      in_stack_ffffffffffffffb4 =
           CONCAT13(in_stack_ffffffffffffffb0 == Ok,(int3)in_stack_ffffffffffffffb4);
    }
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
    this = (QDataStream *)
           QList<QTzType>::operator[]
                     ((QList<QTzType> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QDataStream::operator>>
              (this,(qint32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    in_stack_ffffffffffffffa4 = QDataStream::status(in_RSI);
    if (in_stack_ffffffffffffffa4 == Ok) {
      QDataStream::operator>>
                ((QDataStream *)(ulong)in_stack_ffffffffffffffa0,
                 (bool *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    in_stack_ffffffffffffffa0 = QDataStream::status(in_RSI);
    if (in_stack_ffffffffffffffa0 == Ok) {
      QDataStream::operator>>
                ((QDataStream *)((ulong)in_stack_ffffffffffffffa4 << 0x20),
                 (quint8 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    in_stack_ffffffffffffff9c = QDataStream::status(in_RSI);
    if (in_stack_ffffffffffffff9c != Ok) {
      QList<QTzType>::resize
                ((QList<QTzType> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (qsizetype)this);
    }
    local_1c = local_1c + 1;
  }
  return in_RDI;
}

Assistant:

static QList<QTzType> parseTzTypes(QDataStream &ds, int tzh_typecnt)
{
    QList<QTzType> types(tzh_typecnt);

    // Parse tzh_typecnt x transition types
    for (int i = 0; i < tzh_typecnt && ds.status() == QDataStream::Ok; ++i) {
        QTzType &type = types[i];
        // Parse UTC Offset, 4 bytes
        ds >> type.tz_gmtoff;
        // Parse Is DST flag, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_isdst;
        // Parse Abbreviation Array Index, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_abbrind;
        if (ds.status() != QDataStream::Ok)
            types.resize(i);
    }

    return types;
}